

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

void Search::generate_training_example
               (search_private *priv,polylabel *losses,float weight,bool add_conditioning,
               float min_loss)

{
  example *peVar1;
  size_t sVar2;
  cb_class *pcVar3;
  ulong uVar4;
  wclass *pwVar5;
  byte in_DL;
  v_array<CB::cb_class> *in_RSI;
  search_private *in_RDI;
  float in_XMM0_Da;
  float fVar6;
  float in_XMM1_Da;
  example *ec_3;
  action a_3;
  action a_2;
  int i_4;
  wclass wc;
  label *lab;
  example *ec_2;
  action a_1;
  uint64_t tmp_offset;
  multi_ex tmp;
  int learner_1;
  size_t is_local_1;
  example *ec_1;
  action a;
  size_t start_K;
  int learner;
  size_t is_local;
  polylabel old_label;
  example *ec;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  size_t i;
  example *in_stack_fffffffffffffe28;
  search_private *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  float in_stack_fffffffffffffe3c;
  wclass *in_stack_fffffffffffffe40;
  example *in_stack_fffffffffffffe48;
  bool local_181;
  float local_150;
  float local_130;
  uint local_114;
  uint local_110;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  uint uVar7;
  uint uVar8;
  char *in_stack_ffffffffffffff38;
  uint64_t uVar9;
  size_t in_stack_ffffffffffffff40;
  example *in_stack_ffffffffffffff48;
  search_private *in_stack_ffffffffffffff50;
  ulong local_a0;
  uint local_8c;
  ulong local_78;
  undefined1 local_70 [40];
  example *local_48;
  ulong local_40;
  ulong local_38;
  ulong local_30;
  ulong local_28;
  float local_1c;
  byte local_15;
  float local_14;
  
  local_15 = in_DL & 1;
  local_1c = in_XMM1_Da;
  if ((in_RDI->cb_learner & 1U) == 0) {
    local_14 = in_XMM0_Da;
    if ((in_XMM1_Da == 3.4028235e+38) && (!NAN(in_XMM1_Da))) {
      for (local_38 = 0; uVar4 = local_38,
          sVar2 = v_array<COST_SENSITIVE::wclass>::size((v_array<COST_SENSITIVE::wclass> *)in_RSI),
          fVar6 = local_1c, uVar4 < sVar2; local_38 = local_38 + 1) {
        pwVar5 = v_array<COST_SENSITIVE::wclass>::operator[]
                           ((v_array<COST_SENSITIVE::wclass> *)in_RSI,local_38);
        if (pwVar5->x <= fVar6) {
          pwVar5 = v_array<COST_SENSITIVE::wclass>::operator[]
                             ((v_array<COST_SENSITIVE::wclass> *)in_RSI,local_38);
          local_150 = pwVar5->x;
        }
        else {
          local_150 = local_1c;
        }
        local_1c = local_150;
      }
    }
    for (local_40 = 0; uVar4 = local_40,
        sVar2 = v_array<COST_SENSITIVE::wclass>::size((v_array<COST_SENSITIVE::wclass> *)in_RSI),
        uVar4 < sVar2; local_40 = local_40 + 1) {
      pwVar5 = v_array<COST_SENSITIVE::wclass>::operator[]
                         ((v_array<COST_SENSITIVE::wclass> *)in_RSI,local_40);
      fVar6 = (pwVar5->x - local_1c) * local_14;
      pwVar5 = v_array<COST_SENSITIVE::wclass>::operator[]
                         ((v_array<COST_SENSITIVE::wclass> *)in_RSI,local_40);
      pwVar5->x = fVar6;
    }
  }
  else {
    if ((in_XMM1_Da == 3.4028235e+38) && (!NAN(in_XMM1_Da))) {
      for (local_28 = 0; uVar4 = local_28, sVar2 = v_array<CB::cb_class>::size(in_RSI),
          fVar6 = local_1c, uVar4 < sVar2; local_28 = local_28 + 1) {
        pcVar3 = v_array<CB::cb_class>::operator[](in_RSI,local_28);
        if (pcVar3->cost <= fVar6) {
          pcVar3 = v_array<CB::cb_class>::operator[](in_RSI,local_28);
          local_130 = pcVar3->cost;
        }
        else {
          local_130 = local_1c;
        }
        local_1c = local_130;
      }
    }
    for (local_30 = 0; uVar4 = local_30, sVar2 = v_array<CB::cb_class>::size(in_RSI), uVar4 < sVar2;
        local_30 = local_30 + 1) {
      pcVar3 = v_array<CB::cb_class>::operator[](in_RSI,local_30);
      fVar6 = pcVar3->cost - local_1c;
      pcVar3 = v_array<CB::cb_class>::operator[](in_RSI,local_30);
      pcVar3->cost = fVar6;
    }
  }
  if ((in_RDI->is_ldf & 1U) == 0) {
    local_48 = in_RDI->learn_ec_ref;
    memcpy(local_70,&local_48->l,0x28);
    memcpy(&local_48->l,in_RSI,0x28);
    if ((local_15 & 1) != 0) {
      v_array<unsigned_int>::size(&in_RDI->learn_condition_on);
      v_array<char>::begin(&in_RDI->learn_condition_on_names);
      v_array<Search::action_repr>::begin(&in_RDI->learn_condition_on_act);
      add_example_conditioning
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                 in_stack_ffffffffffffff38,
                 (action_repr *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    }
    for (local_78 = 0; local_78 <= (in_RDI->xv & 1); local_78 = local_78 + 1) {
      select_learner(in_RDI,in_RDI->current_policy,in_RDI->learn_learner_id,true,local_78 != 0);
      local_48->in_use = true;
      LEARNER::as_singleline<char,char>((learner<char,_char> *)in_RSI);
      LEARNER::learner<char,_example>::learn
                ((learner<char,_example> *)in_stack_fffffffffffffe40,
                 (example *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                 (size_t)in_stack_fffffffffffffe30);
    }
    if ((local_15 & 1) != 0) {
      del_example_conditioning(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    }
    memcpy(&local_48->l,local_70,0x28);
    in_RDI->total_examples_generated = in_RDI->total_examples_generated + 1;
  }
  else {
    local_181 = false;
    if ((in_RDI->is_ldf & 1U) != 0) {
      local_181 = COST_SENSITIVE::ec_is_example_header(in_stack_fffffffffffffe48);
    }
    local_114 = (uint)(local_181 != false);
    uVar4 = (ulong)(int)local_114;
    local_8c = local_114;
    if ((local_15 & 1) != 0) {
      for (; (ulong)local_8c < in_RDI->learn_ec_ref_cnt; local_8c = local_8c + 1) {
        v_array<unsigned_int>::size(&in_RDI->learn_condition_on);
        v_array<char>::begin(&in_RDI->learn_condition_on_names);
        v_array<Search::action_repr>::begin(&in_RDI->learn_condition_on_act);
        add_example_conditioning
                  (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                   in_stack_ffffffffffffff38,
                   (action_repr *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      }
    }
    for (local_a0 = 0; local_a0 <= (in_RDI->xv & 1); local_a0 = local_a0 + 1) {
      select_learner(in_RDI,in_RDI->current_policy,in_RDI->learn_learner_id,true,local_a0 != 0);
      std::vector<example_*,_std::allocator<example_*>_>::vector
                ((vector<example_*,_std::allocator<example_*>_> *)0x39eaf3);
      uVar9 = 0;
      uVar7 = local_114;
      if (uVar4 < in_RDI->learn_ec_ref_cnt) {
        uVar9 = in_RDI->learn_ec_ref[uVar4].super_example_predict.ft_offset;
      }
      while ((ulong)uVar7 < in_RDI->learn_ec_ref_cnt) {
        peVar1 = in_RDI->learn_ec_ref;
        uVar8 = uVar7;
        sVar2 = v_array<COST_SENSITIVE::wclass>::size
                          ((v_array<COST_SENSITIVE::wclass> *)&peVar1[uVar7].l.simple);
        if (sVar2 == 0) {
          v_array<COST_SENSITIVE::wclass>::push_back
                    ((v_array<COST_SENSITIVE::wclass> *)in_stack_fffffffffffffe30,
                     (wclass *)in_stack_fffffffffffffe28);
        }
        pwVar5 = v_array<COST_SENSITIVE::wclass>::operator[]
                           ((v_array<COST_SENSITIVE::wclass> *)in_RSI,uVar8 - uVar4);
        in_stack_fffffffffffffe3c = pwVar5->x;
        in_stack_fffffffffffffe40 =
             v_array<COST_SENSITIVE::wclass>::operator[]
                       ((v_array<COST_SENSITIVE::wclass> *)&peVar1[uVar7].l.simple,0);
        in_stack_fffffffffffffe40->x = in_stack_fffffffffffffe3c;
        peVar1[uVar7].in_use = true;
        peVar1[uVar7].super_example_predict.ft_offset = in_RDI->offset;
        std::vector<example_*,_std::allocator<example_*>_>::push_back
                  ((vector<example_*,_std::allocator<example_*>_> *)in_stack_fffffffffffffe30,
                   (value_type *)in_stack_fffffffffffffe28);
        in_RDI->total_examples_generated = in_RDI->total_examples_generated + 1;
        uVar7 = uVar8 + 1;
      }
      in_stack_fffffffffffffe30 =
           (search_private *)LEARNER::as_multiline<char,char>((learner<char,_char> *)in_RSI);
      LEARNER::learner<char,_std::vector<example_*,_std::allocator<example_*>_>_>::learn
                ((learner<char,_std::vector<example_*,_std::allocator<example_*>_>_> *)
                 in_stack_fffffffffffffe40,
                 (vector<example_*,_std::allocator<example_*>_> *)
                 CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                 (size_t)in_stack_fffffffffffffe30);
      for (local_110 = local_114; (ulong)local_110 < in_RDI->learn_ec_ref_cnt;
          local_110 = local_110 + 1) {
        in_RDI->learn_ec_ref[local_110].super_example_predict.ft_offset = uVar9;
      }
      std::vector<example_*,_std::allocator<example_*>_>::~vector
                ((vector<example_*,_std::allocator<example_*>_> *)in_stack_fffffffffffffe40);
    }
    if ((local_15 & 1) != 0) {
      for (; (ulong)local_114 < in_RDI->learn_ec_ref_cnt; local_114 = local_114 + 1) {
        del_example_conditioning(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      }
    }
  }
  return;
}

Assistant:

void generate_training_example(search_private& priv, polylabel& losses, float weight, bool add_conditioning = true,
    float min_loss = FLT_MAX)  // min_loss = FLT_MAX means "please compute it for me as the actual min"; any other value
                               // means to use this
{
  // should we really subtract out min-loss?
  // float min_loss = FLT_MAX;
  if (priv.cb_learner)
  {
    if (min_loss == FLT_MAX)
      for (size_t i = 0; i < losses.cb.costs.size(); i++) min_loss = MIN(min_loss, losses.cb.costs[i].cost);
    for (size_t i = 0; i < losses.cb.costs.size(); i++) losses.cb.costs[i].cost = losses.cb.costs[i].cost - min_loss;
  }
  else
  {
    if (min_loss == FLT_MAX)
      for (size_t i = 0; i < losses.cs.costs.size(); i++) min_loss = MIN(min_loss, losses.cs.costs[i].x);
    for (size_t i = 0; i < losses.cs.costs.size(); i++)
      losses.cs.costs[i].x = (losses.cs.costs[i].x - min_loss) * weight;
  }
  // cerr << "losses = ["; for (size_t i=0; i<losses.cs.costs.size(); i++) cerr << ' ' << losses.cs.costs[i].class_index
  // << ':' << losses.cs.costs[i].x; cerr << " ]" << endl;

  if (!priv.is_ldf)  // not LDF
  {
    // since we're not LDF, it should be the case that ec_ref_cnt == 1
    // and learn_ec_ref[0] is a pointer to a single example
    assert(priv.learn_ec_ref_cnt == 1);
    assert(priv.learn_ec_ref != nullptr);

    example& ec = priv.learn_ec_ref[0];
    polylabel old_label = ec.l;
    ec.l = losses;  // labels;
    if (add_conditioning)
      add_example_conditioning(priv, ec, priv.learn_condition_on.size(), priv.learn_condition_on_names.begin(),
          priv.learn_condition_on_act.begin());
    for (size_t is_local = 0; is_local <= (size_t)priv.xv; is_local++)
    {
      int learner = select_learner(priv, priv.current_policy, priv.learn_learner_id, true, is_local > 0);
      ec.in_use = true;
      cdbg << "BEGIN base_learner->learn(ec, " << learner << ")" << endl;
      as_singleline(priv.base_learner)->learn(ec, learner);
      cdbg << "END   base_learner->learn(ec, " << learner << ")" << endl;
    }
    if (add_conditioning)
      del_example_conditioning(priv, ec);
    ec.l = old_label;
    priv.total_examples_generated++;
  }
  else  // is  LDF
  {
    assert(cs_get_costs_size(priv.cb_learner, losses) == priv.learn_ec_ref_cnt);
    size_t start_K = (priv.is_ldf && COST_SENSITIVE::ec_is_example_header(priv.learn_ec_ref[0])) ? 1 : 0;

    // TODO: weight
    if (add_conditioning)
      for (action a = (uint32_t)start_K; a < priv.learn_ec_ref_cnt; a++)
      {
        example& ec = priv.learn_ec_ref[a];
        add_example_conditioning(priv, ec, priv.learn_condition_on.size(), priv.learn_condition_on_names.begin(),
            priv.learn_condition_on_act.begin());
      }

    for (size_t is_local = 0; is_local <= (size_t)priv.xv; is_local++)
    {
      int learner = select_learner(priv, priv.current_policy, priv.learn_learner_id, true, is_local > 0);

      // create an example collection for

      multi_ex tmp;
      uint64_t tmp_offset = 0;
      if (priv.learn_ec_ref_cnt > start_K)
        tmp_offset = priv.learn_ec_ref[start_K].ft_offset;
      for (action a = (uint32_t)start_K; a < priv.learn_ec_ref_cnt; a++)
      {
        example& ec = priv.learn_ec_ref[a];
        CS::label& lab = ec.l.cs;
        if (lab.costs.size() == 0)
        {
          CS::wclass wc = {0., a - (uint32_t)start_K, 0., 0.};
          lab.costs.push_back(wc);
        }
        lab.costs[0].x = losses.cs.costs[a - start_K].x;
        ec.in_use = true;
        // store the offset to restore it later
        ec.ft_offset = priv.offset;
        // create the example collection used to learn
        tmp.push_back(&ec);
        cdbg << "generate_training_example called learn on action a=" << a << ", costs.size=" << lab.costs.size()
             << " ec=" << &ec << endl;
        priv.total_examples_generated++;
      }

      // learn with the multiline example
      as_multiline(priv.base_learner)->learn(tmp, learner);

      // restore the offsets in examples
      int i = 0;
      for (action a = (uint32_t)start_K; a < priv.learn_ec_ref_cnt; a++, i++)
        priv.learn_ec_ref[a].ft_offset = tmp_offset;
    }

    if (add_conditioning)
      for (action a = (uint32_t)start_K; a < priv.learn_ec_ref_cnt; a++)
      {
        example& ec = priv.learn_ec_ref[a];
        del_example_conditioning(priv, ec);
      }
  }
}